

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall helics::apps::Echo::Echo(Echo *this,string_view name,string *jsonString)

{
  undefined8 *in_RDI;
  string *in_stack_000001b8;
  App *in_stack_000001c0;
  undefined1 in_stack_000001c8 [16];
  Echo *in_stack_00000470;
  Echo *this_00;
  
  App::App(in_stack_000001c0,(string_view)in_stack_000001c8,in_stack_000001b8);
  *in_RDI = &PTR__Echo_00a47320;
  this_00 = (Echo *)(in_RDI + 0x14);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x4059b2);
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  std::mutex::mutex((mutex *)0x4059da);
  processArgs(in_stack_00000470);
  initialSetup(this_00);
  return;
}

Assistant:

Echo::Echo(std::string_view name, const std::string& jsonString): App(name, jsonString)
    {
        processArgs();
        initialSetup();
    }